

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::RenderDeviceGLImpl::CreateShader
          (RenderDeviceGLImpl *this,ShaderCreateInfo *ShaderCreateInfo,IShader **ppShader,
          IDataBlob **ppCompilerOutput,bool bIsDeviceInternal)

{
  undefined1 local_48 [8];
  CreateInfo GLShaderCI;
  bool bIsDeviceInternal_local;
  IDataBlob **ppCompilerOutput_local;
  IShader **ppShader_local;
  ShaderCreateInfo *ShaderCreateInfo_local;
  RenderDeviceGLImpl *this_local;
  
  GLShaderCI.ppCompilerOutput._7_1_ = bIsDeviceInternal;
  local_48 = (undefined1  [8])
             RenderDeviceBase<Diligent::EngineGLImplTraits>::GetDeviceInfo
                       (&this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>);
  GLShaderCI.DeviceInfo =
       (RenderDeviceInfo *)
       RenderDeviceBase<Diligent::EngineGLImplTraits>::GetAdapterInfo
                 (&this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>);
  GLShaderCI.AdapterInfo = (GraphicsAdapterInfo *)ppCompilerOutput;
  RenderDeviceBase<Diligent::EngineGLImplTraits>::
  CreateShaderImpl<Diligent::ShaderGLImpl::CreateInfo,bool>
            (&this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>,ppShader,ShaderCreateInfo,
             (CreateInfo *)local_48,(bool *)((long)&GLShaderCI.ppCompilerOutput + 7));
  return;
}

Assistant:

void RenderDeviceGLImpl::CreateShader(const ShaderCreateInfo& ShaderCreateInfo,
                                      IShader**               ppShader,
                                      IDataBlob**             ppCompilerOutput,
                                      bool                    bIsDeviceInternal)
{
    const ShaderGLImpl::CreateInfo GLShaderCI{
        GetDeviceInfo(),
        GetAdapterInfo(),
        ppCompilerOutput,
    };
    CreateShaderImpl(ppShader, ShaderCreateInfo, GLShaderCI, bIsDeviceInternal);
}